

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<kj::Array<char>_> *
kj::parse::Many_<const_kj::parse::Any__&,_false>::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_char>::apply
          (Maybe<kj::Array<char>_> *__return_storage_ptr__,Any_ *subParser,
          IteratorInput<char,_const_char_*> *input)

{
  char cVar1;
  char *pcVar2;
  size_t newSize;
  char *pcVar3;
  Results results;
  Vector<char> local_58;
  
  local_58.builder.ptr = (char *)0x0;
  local_58.builder.pos = (char *)0x0;
  local_58.builder.endPtr = (char *)0x0;
  pcVar3 = input->pos;
  if (pcVar3 != input->end) {
    do {
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      input->pos = pcVar3;
      if (local_58.builder.pos == local_58.builder.endPtr) {
        newSize = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
        if (local_58.builder.endPtr == local_58.builder.ptr) {
          newSize = 4;
        }
        Vector<char>::setCapacity(&local_58,newSize);
      }
      *local_58.builder.pos = cVar1;
      local_58.builder.pos = local_58.builder.pos + 1;
      pcVar2 = input->best;
      if (input->best < pcVar3) {
        pcVar2 = pcVar3;
      }
      pcVar3 = input->pos;
      input->best = pcVar2;
    } while (pcVar3 != input->end);
  }
  if (local_58.builder.pos != local_58.builder.endPtr) {
    Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr);
  }
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.ptr = local_58.builder.ptr;
  (__return_storage_ptr__->ptr).field_1.value.size_ =
       (long)local_58.builder.pos - (long)local_58.builder.ptr;
  (__return_storage_ptr__->ptr).field_1.value.disposer = local_58.builder.disposer;
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }